

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_defs.h
# Opt level: O2

crn_packed_uint<3U> * __thiscall
crnd::crn_packed_uint<3U>::operator=(crn_packed_uint<3U> *this,uint val)

{
  uint i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    this->m_buf[lVar1] = (uchar)(val >> 0x10);
    val = val << 8;
  }
  return this;
}

Assistant:

inline crn_packed_uint& operator=(unsigned int val)
        {
            //CRND_ASSERT((N == 4U) || (val < (1U << (N * 8U))));

            val <<= (8U * (4U - N));

            for (unsigned int i = 0; i < N; i++)
            {
                m_buf[i] = static_cast<unsigned char>(val >> 24U);
                val <<= 8U;
            }

            return *this;
        }